

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<5,_0,_0>::propagate(BinGE<5,_0,_0> *this)

{
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  IntVar *pIVar7;
  int64_t m_v;
  long lVar8;
  long lVar9;
  
  pIVar3 = (this->x).var;
  pIVar7 = (this->y).var;
  iVar2 = (pIVar3->min).v;
  lVar9 = (long)(this->x).b;
  lVar8 = (long)(pIVar7->min).v;
  if (lVar9 - (pIVar3->max).v < lVar8) {
    if (so.lazy) {
      iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
      lVar4 = (long)iVar1 * 4 + 2;
      pIVar3 = (this->x).var;
      lVar6 = (long)(this->x).b;
    }
    else {
      lVar4 = 0;
      lVar6 = lVar9;
    }
    iVar1 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar3,lVar6 - lVar8,lVar4,1);
    if ((char)iVar1 != '\0') {
      pIVar7 = (this->y).var;
      goto LAB_0019194a;
    }
LAB_001919bf:
    bVar5 = false;
  }
  else {
LAB_0019194a:
    lVar9 = lVar9 - iVar2;
    lVar8 = (long)(pIVar7->max).v;
    if (lVar9 < lVar8) {
      if (so.lazy == true) {
        iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        lVar8 = (long)iVar2 * 4 + 2;
        pIVar7 = (this->y).var;
      }
      else {
        lVar8 = 0;
      }
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])(pIVar7,lVar9,lVar8,1);
      if ((char)iVar2 == '\0') goto LAB_001919bf;
      lVar8 = (long)(((this->y).var)->max).v;
    }
    bVar5 = true;
    if (lVar8 <= (long)(this->x).b - (long)(((this->x).var)->max).v) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  return bVar5;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}